

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall FxStringCast::FxStringCast(FxStringCast *this,FxExpression *x)

{
  FxExpression *x_local;
  FxStringCast *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_StringCast,&x->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxStringCast_00a09d60;
  this->basex = x;
  (this->super_FxExpression).ValueType = (PType *)TypeString;
  return;
}

Assistant:

FxStringCast::FxStringCast(FxExpression *x)
	: FxExpression(EFX_StringCast, x->ScriptPosition)
{
	basex = x;
	ValueType = TypeString;
}